

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_bonsai_trie.hpp
# Opt level: O2

bool __thiscall
poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::add_child
          (plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *this,uint64_t *node_id,uint64_t symb)

{
  uint64_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  ulong i;
  ulong x;
  
  x = *node_id << ((ulong)(byte)(this->symb_size_).bits_ & 0x3f) | symb;
  uVar1 = hash::vigna_hasher::hash(x);
  uVar3 = (this->capa_size_).mask_;
  do {
    i = uVar1 & uVar3;
    if (1 < i) {
      uVar1 = compact_vector::get(&this->table_,i);
      if (uVar1 == 0) {
        if (this->size_ == this->max_size_) {
          return false;
        }
        compact_vector::set(&this->table_,i,x);
        this->size_ = this->size_ + 1;
LAB_0015122e:
        *node_id = i;
        return uVar1 == 0;
      }
      uVar2 = compact_vector::get(&this->table_,i);
      if (uVar2 == x) goto LAB_0015122e;
      uVar3 = (this->capa_size_).mask_;
    }
    uVar1 = i + 1;
  } while( true );
}

Assistant:

bool add_child(uint64_t& node_id, uint64_t symb) {
        assert(node_id < capa_size_.size());
        assert(symb < symb_size_.size());

        uint64_t key = make_key_(node_id, symb);
        assert(key != 0);

        for (uint64_t i = Hasher::hash(key) & capa_size_.mask();; i = right_(i)) {
            if (i == 0) {
                // table_[0] is always empty so that any table_[i] = 0 indicates to be empty.
                continue;
            }

            if (i == get_root()) {
                continue;
            }

            if (table_[i] == 0) {
                // this slot is empty
                if (size_ == max_size_) {
                    return false;  // needs to expand
                }

                table_.set(i, key);

                ++size_;
                node_id = i;

                return true;
            }

            if (table_[i] == key) {
                node_id = i;
                return false;  // already stored
            }
        }
    }